

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O1

int ecs_fini(ecs_world_t *world)

{
  int32_t iVar1;
  uint uVar2;
  ecs_table_t *peVar3;
  void *pvVar4;
  ecs_vector_t *peVar5;
  long lVar6;
  ulong uVar7;
  int32_t dense_index;
  int dense_index_00;
  ecs_map_iter_t it;
  ecs_map_iter_t local_50;
  
  _ecs_assert(world->magic == 0x65637377,2,(char *)0x0,"world->magic == ECS_WORLD_MAGIC",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x22b);
  if (world->magic != 0x65637377) {
    __assert_fail("world->magic == (0x65637377)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x22b,"int ecs_fini(ecs_world_t *)");
  }
  _ecs_assert((_Bool)(world->in_progress ^ 1),0x32,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x22c);
  if (world->in_progress == true) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x22c,"int ecs_fini(ecs_world_t *)");
  }
  _ecs_assert((_Bool)(world->is_merging ^ 1),0x32,(char *)0x0,"!world->is_merging",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x22d);
  if (world->is_merging == true) {
    __assert_fail("!world->is_merging",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x22d,"int ecs_fini(ecs_world_t *)");
  }
  _ecs_assert((_Bool)(world->is_fini ^ 1),0x32,(char *)0x0,"!world->is_fini",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x22e);
  if (world->is_fini != true) {
    world->is_fini = true;
    iVar1 = ecs_sparse_count((world->store).tables);
    if (0 < iVar1) {
      dense_index = 0;
      do {
        peVar3 = (ecs_table_t *)_ecs_sparse_get((world->store).tables,0x80,dense_index);
        ecs_table_unset(world,peVar3);
        dense_index = dense_index + 1;
      } while (iVar1 != dense_index);
    }
    uVar2 = ecs_vector_count(world->fini_actions);
    pvVar4 = _ecs_vector_first(world->fini_actions,0x10,0x10);
    if (0 < (int)uVar2) {
      lVar6 = 0;
      do {
        (**(code **)((long)pvVar4 + lVar6))(world,*(undefined8 *)((long)pvVar4 + lVar6 + 8));
        lVar6 = lVar6 + 0x10;
      } while ((ulong)uVar2 << 4 != lVar6);
    }
    ecs_vector_free(world->fini_actions);
    if (world->locking_enabled == true) {
      (*ecs_os_api.mutex_free_)(world->mutex);
    }
    ecs_stage_deinit(world,&world->stage);
    ecs_stage_deinit(world,&world->temp_stage);
    iVar1 = ecs_sparse_count((world->store).tables);
    if (0 < iVar1) {
      dense_index_00 = 0;
      do {
        peVar3 = (ecs_table_t *)_ecs_sparse_get((world->store).tables,0x80,dense_index_00);
        ecs_table_free(world,peVar3);
        dense_index_00 = dense_index_00 + 1;
      } while (iVar1 != dense_index_00);
    }
    if (iVar1 != 0) {
      ecs_table_reset(world,&(world->store).root);
    }
    ecs_sparse_free((world->store).tables);
    ecs_table_free(world,&(world->store).root);
    ecs_sparse_free((world->store).entity_index);
    ecs_map_iter((world->store).table_map);
    peVar5 = (ecs_vector_t *)_ecs_map_next_ptr(&local_50,(ecs_map_key_t *)0x0);
    if (peVar5 != (ecs_vector_t *)0x0) {
      do {
        ecs_vector_free(peVar5);
        peVar5 = (ecs_vector_t *)_ecs_map_next_ptr(&local_50,(ecs_map_key_t *)0x0);
      } while (peVar5 != (ecs_vector_t *)0x0);
    }
    ecs_map_free((world->store).table_map);
    lVar6 = 0x28;
    do {
      ecs_vector_free(*(ecs_vector_t **)((long)world->c_info + lVar6 + -0x20));
      ecs_vector_free(*(ecs_vector_t **)((long)world->c_info + lVar6 + -0x18));
      lVar6 = lVar6 + 0x48;
    } while (lVar6 != 0x4828);
    ecs_map_iter(world->t_info);
    pvVar4 = _ecs_map_next(&local_50,0x48,(ecs_map_key_t *)0x0);
    if (pvVar4 != (void *)0x0) {
      do {
        ecs_vector_free(*(ecs_vector_t **)((long)pvVar4 + 8));
        ecs_vector_free(*(ecs_vector_t **)((long)pvVar4 + 0x10));
        pvVar4 = _ecs_map_next(&local_50,0x48,(ecs_map_key_t *)0x0);
      } while (pvVar4 != (void *)0x0);
    }
    ecs_map_free(world->t_info);
    peVar5 = world->queries;
    world->queries = (ecs_vector_t *)0x0;
    uVar2 = ecs_vector_count(peVar5);
    pvVar4 = _ecs_vector_first(peVar5,8,0x10);
    if (0 < (int)uVar2) {
      uVar7 = 0;
      do {
        ecs_query_free(*(ecs_query_t **)((long)pvVar4 + uVar7 * 8));
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    ecs_vector_free(peVar5);
    ecs_map_iter(world->child_tables);
    peVar5 = (ecs_vector_t *)_ecs_map_next_ptr(&local_50,(ecs_map_key_t *)0x0);
    if (peVar5 != (ecs_vector_t *)0x0) {
      do {
        ecs_vector_free(peVar5);
        peVar5 = (ecs_vector_t *)_ecs_map_next_ptr(&local_50,(ecs_map_key_t *)0x0);
      } while (peVar5 != (ecs_vector_t *)0x0);
    }
    ecs_map_free(world->child_tables);
    uVar2 = ecs_vector_count(world->aliases);
    pvVar4 = _ecs_vector_first(world->aliases,0x10,0x10);
    if (0 < (int)uVar2) {
      lVar6 = 0;
      do {
        (*ecs_os_api.free_)(*(void **)((long)pvVar4 + lVar6));
        lVar6 = lVar6 + 0x10;
      } while ((ulong)uVar2 << 4 != lVar6);
    }
    ecs_vector_free(world->aliases);
    on_demand_in_map_deinit(world->on_activate_components);
    on_demand_in_map_deinit(world->on_enable_components);
    ecs_map_free(world->type_handles);
    ecs_vector_free(world->fini_tasks);
    lVar6 = 0x939;
    do {
      ecs_vector_free(*(ecs_vector_t **)((long)world->c_info + lVar6 * 8 + -0x18));
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xa39);
    lVar6 = 0xa5a;
    do {
      ecs_vector_free(*(ecs_vector_t **)((long)world->c_info + lVar6 * 8 + -0x18));
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xb5a);
    world->magic = 0;
    ecs_increase_timer_resolution(false);
    (*ecs_os_api.free_)(world);
    ecs_os_fini();
    return 0;
  }
  __assert_fail("!world->is_fini",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x22e,"int ecs_fini(ecs_world_t *)");
}

Assistant:

int ecs_fini(
    ecs_world_t *world)
{
    ecs_assert(world->magic == ECS_WORLD_MAGIC, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(!world->in_progress, ECS_INVALID_OPERATION, NULL);
    ecs_assert(!world->is_merging, ECS_INVALID_OPERATION, NULL);
    ecs_assert(!world->is_fini, ECS_INVALID_OPERATION, NULL);

    world->is_fini = true;

    fini_unset_tables(world);

    fini_actions(world);    

    if (world->locking_enabled) {
        ecs_os_mutex_free(world->mutex);
    }

    fini_stages(world);

    fini_store(world);

    fini_component_lifecycle(world);

    fini_queries(world);

    fini_child_tables(world);

    fini_aliases(world);

    fini_misc(world);

    /* In case the application tries to use the memory of the freed world, this
     * will trigger an assert */
    world->magic = 0;

    ecs_increase_timer_resolution(0);

    /* End of the world */
    ecs_os_free(world);

    ecs_os_fini(); 

    return 0;
}